

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_xformOps_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps,uint32_t indent)

{
  long lVar1;
  string *psVar2;
  uint32_t uVar3;
  const_iterator cVar4;
  ostream *poVar5;
  uint32_t indent_00;
  _Rb_tree_header *p_Var6;
  uint32_t extraout_EDX;
  OpType *op;
  ulong uVar7;
  undefined1 in_R8B;
  long lVar8;
  long lVar9;
  bool bVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  optional<tinyusdz::value::Value> pv;
  string varname;
  value_type xformOp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  printed_vars;
  stringstream ss;
  undefined1 local_2d0 [8];
  undefined1 local_2c8 [24];
  undefined1 local_2b0;
  bool local_2a8 [8];
  undefined1 local_2a0 [24];
  undefined8 uStack_288;
  string local_280;
  undefined1 local_260 [8];
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  storage_union local_238;
  vtable_type *local_228;
  bool local_220;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_218;
  bool local_200;
  bool local_1f8;
  string *local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  p_Var6 = &local_1e8._M_impl.super__Rb_tree_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  if ((*(long *)(this + 8) != *(long *)this) &&
     (lVar9 = *(long *)this, *(long *)(this + 8) != lVar9)) {
    lVar8 = 0x48;
    uVar7 = 0;
    do {
      indent_00 = (uint32_t)p_Var6;
      local_260[4] = *(bool *)(lVar9 + -0x44 + lVar8);
      local_260._0_4_ = *(OpType *)(lVar9 + -0x48 + lVar8);
      lVar1 = *(long *)(lVar9 + -0x40 + lVar8);
      local_258._0_8_ = &local_248;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_258,lVar1,*(long *)(lVar9 + -0x38 + lVar8) + lVar1);
      local_228 = *(vtable_type **)(lVar9 + -0x10 + lVar8);
      lVar1 = *(long *)(lVar9 + -0x10 + lVar8);
      if (lVar1 != 0) {
        (**(code **)(lVar1 + 0x28))(lVar9 + lVar8 + -0x20,&local_238);
      }
      local_220 = *(bool *)(lVar9 + -8 + lVar8);
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::vector(&local_218,
               (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                *)(lVar9 + lVar8));
      local_200 = *(bool *)(lVar9 + 0x18 + lVar8);
      local_1f8 = *(bool *)(lVar9 + 0x20 + lVar8);
      if (local_260._0_4_ != ResetXformStack) {
        to_string_abi_cxx11_(&local_280,(tinyusdz *)local_260,op);
        if (local_258._8_8_ != 0) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2d0,":",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258);
          ::std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_2d0);
          if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
            operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
          }
        }
        if ((local_220 == false) &&
           (((local_228 != (vtable_type *)0x0 && (uVar3 = (*local_228->type_id)(), uVar3 == 0)) ||
            ((local_228 != (vtable_type *)0x0 && (uVar3 = (*local_228->type_id)(), uVar3 == 1))))))
        {
LAB_002c61af:
          if (local_218.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_218.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_2d0 = (undefined1  [8])(local_2c8 + 8);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d0,local_280._M_dataplus._M_p,
                       local_280._M_dataplus._M_p + local_280._M_string_length);
            ::std::__cxx11::string::append((char *)local_2d0);
            cVar4 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_1e8,(key_type *)local_2d0);
            if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
              operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
            }
            if ((_Rb_tree_header *)cVar4._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
              local_2d0 = (undefined1  [8])(local_2c8 + 8);
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2d0,local_280._M_dataplus._M_p,
                         local_280._M_dataplus._M_p + local_280._M_string_length);
              ::std::__cxx11::string::append((char *)local_2d0);
              pVar11 = ::std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&local_1e8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2d0);
              uVar3 = pVar11._8_4_;
              if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
                operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
                uVar3 = extraout_EDX;
              }
              pprint::Indent_abi_cxx11_
                        ((string *)local_2d0,(pprint *)((ulong)xformOps & 0xffffffff),uVar3);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_2d0,local_2c8._0_8_);
              if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
                operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
              }
              primvar::PrimVar::type_name_abi_cxx11_((string *)local_2d0,(PrimVar *)&local_238);
              poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,(char *)local_2d0,local_2c8._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
                operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
              }
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples",0xc);
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
              if (local_218.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_218.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_2a8[0] = false;
                local_2a0._16_8_ = (pointer)0x0;
                uStack_288 = 0;
                local_2a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_2a0._8_8_ = (pointer)0x0;
              }
              else {
                local_2a8[0] = true;
                std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                          *)local_2a0,&local_218);
                uStack_288 = CONCAT71(uStack_288._1_7_,local_200);
              }
              local_2d0[0] = local_2a8[0];
              if (local_2a8[0] == true) {
                local_2c8._0_8_ = local_2a0._0_8_;
                local_2c8._8_8_ = local_2a0._8_8_;
                local_2c8._16_8_ = local_2a0._16_8_;
                local_2a0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_2a0._8_8_ = (pointer)0x0;
                local_2a0._16_8_ = (pointer)0x0;
                local_2b0 = (undefined1)uStack_288;
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_2a0);
              }
              if (local_2d0[0] == '\x01') {
                print_timesamples_abi_cxx11_
                          ((string *)local_2a8,(tinyusdz *)local_2c8,
                           (TimeSamples *)((ulong)xformOps & 0xffffffff),indent_00);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,(char *)CONCAT71(local_2a8._1_7_,local_2a8[0]),local_2a0._0_8_)
                ;
                if ((undefined1 *)CONCAT71(local_2a8._1_7_,local_2a8[0]) != local_2a0 + 8) {
                  operator_delete((undefined1 *)CONCAT71(local_2a8._1_7_,local_2a8[0]),
                                  (ulong)(local_2a0._8_8_ + 1));
                }
              }
              else {
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,"[InternalError]",0xf);
              }
              if (local_2d0[0] == '\x01') {
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_2c8);
              }
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
            }
          }
        }
        else {
          cVar4 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_1e8,&local_280);
          p_Var6 = &local_1e8._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar4._M_node == p_Var6) {
            pVar11 = ::std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_1e8,&local_280);
            indent_00 = (uint32_t)p_Var6;
            pprint::Indent_abi_cxx11_
                      ((string *)local_2d0,(pprint *)((ulong)xformOps & 0xffffffff),pVar11._8_4_);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_2d0,local_2c8._0_8_);
            if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
              operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
            }
            primvar::PrimVar::type_name_abi_cxx11_((string *)local_2d0,(PrimVar *)&local_238);
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_2d0,local_2c8._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if (local_2d0 != (undefined1  [8])(local_2c8 + 8)) {
              operator_delete((void *)local_2d0,local_2c8._8_8_ + 1);
            }
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
            if (local_1f8 == false) {
              if (local_228 == (vtable_type *)0x0) {
                bVar10 = false;
              }
              else {
                uVar3 = (*local_228->type_id)();
                bVar10 = uVar3 == 4;
              }
              if ((bVar10) || ((local_220 & 1U) != 0)) goto LAB_002c617f;
              XformOp::get_scalar((optional<tinyusdz::value::Value> *)local_2a8,(XformOp *)local_260
                                 );
              local_2d0[0] = local_2a8[0];
              if ((local_2a8[0] == true) &&
                 (local_2c8._16_8_ = local_2a0._16_8_, (pointer)local_2a0._16_8_ != (pointer)0x0)) {
                (**(code **)&(((Value *)(local_2a0._16_8_ + 0x30))->v_).storage)
                          (local_2a0,local_2c8);
                local_2a0._16_8_ = (pointer)0x0;
              }
              if ((local_2a8[0] == true) && ((pointer)local_2a0._16_8_ != (pointer)0x0)) {
                (**(code **)(local_2a0._16_8_ + 0x20))(local_2a0);
                local_2a0._16_8_ = (pointer)0x0;
              }
              if (local_2d0[0] == '\x01') {
                indent_00 = 1;
                value::pprint_value_abi_cxx11_
                          ((string *)local_2a8,(value *)local_2c8,
                           (Value *)((ulong)xformOps & 0xffffffff),1,(bool)in_R8B);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,(char *)CONCAT71(local_2a8._1_7_,local_2a8[0]),local_2a0._0_8_)
                ;
                if ((undefined1 *)CONCAT71(local_2a8._1_7_,local_2a8[0]) != local_2a0 + 8) {
                  operator_delete((undefined1 *)CONCAT71(local_2a8._1_7_,local_2a8[0]),
                                  (ulong)(local_2a0._8_8_ + 1));
                }
              }
              else {
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,"[InternalError]",0xf);
              }
              if ((local_2d0[0] == '\x01') && (local_2c8._16_8_ != 0)) {
                (**(code **)(local_2c8._16_8_ + 0x20))(local_2c8);
                local_2c8._16_8_ = 0;
              }
            }
            else {
LAB_002c617f:
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"None",4);
            }
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
            goto LAB_002c61af;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&local_218);
      if (local_228 != (vtable_type *)0x0) {
        (*local_228->destroy)(&local_238);
        local_228 = (vtable_type *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ != &local_248) {
        operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
      lVar9 = *(long *)this;
      p_Var6 = (_Rb_tree_header *)0x6db6db6db6db6db7;
      lVar8 = lVar8 + 0x70;
    } while (uVar7 < (ulong)((*(long *)(this + 8) - lVar9 >> 4) * 0x6db6db6db6db6db7));
  }
  print_xformOpOrder_abi_cxx11_
            ((string *)local_260,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)
             ((ulong)xformOps & 0xffffffff),(uint32_t)p_Var6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)CONCAT44(local_260._4_4_,local_260._0_4_),local_258._0_8_);
  if ((undefined1 *)CONCAT44(local_260._4_4_,local_260._0_4_) != local_258 + 8) {
    operator_delete((undefined1 *)CONCAT44(local_260._4_4_,local_260._0_4_),local_258._8_8_ + 1);
  }
  psVar2 = local_1f0;
  ::std::__cxx11::stringbuf::str();
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_1e8,(_Link_type)local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string print_xformOps(const std::vector<XformOp> &xformOps,
                           const uint32_t indent) {
  std::stringstream ss;

  // To prevent printing xformOp attributes multiple times.
  std::set<std::string> printed_vars;

  // xforms props
  if (xformOps.size()) {
    for (size_t i = 0; i < xformOps.size(); i++) {
      const auto xformOp = xformOps[i];

      if (xformOp.op_type == XformOp::OpType::ResetXformStack) {
        // No need to print value.
        continue;
      }

      std::string varname = to_string(xformOp.op_type);
      if (!xformOp.suffix.empty()) {
        varname += ":" + xformOp.suffix;
      }

      DCOUT("has_default " << xformOp.has_default());
      DCOUT("has_timesamples " << xformOp.has_timesamples());

      if (xformOp.has_default()) {
        if (printed_vars.count(varname)) {
          continue;
        }

        printed_vars.insert(varname);

        ss << pprint::Indent(indent);
        ss << xformOp.get_value_type_name() << " ";
        ss << varname;
        ss << " = ";

        if (xformOp.is_blocked()) {
          ss << "None";
        } else if (auto pv = xformOp.get_scalar()) {
          ss << value::pprint_value(pv.value(), indent);
        } else {
          ss << "[InternalError]";
        }

        // TODO: metadata
        ss << "\n";
      }

      if (xformOp.has_timesamples()) {

        if (printed_vars.count(varname + ".timeSamples")) {
          continue;
        }

        printed_vars.insert(varname + ".timeSamples");

        ss << pprint::Indent(indent);
        ss << xformOp.get_value_type_name() << " ";
        ss << varname;
        ss << ".timeSamples";
        ss << " = ";

        if (auto pv = xformOp.get_timesamples()) {
          ss << print_timesamples(pv.value(), indent);
        } else {
          ss << "[InternalError]";
        }
        ss << "\n";
      }

    }
  }

  // uniform token[] xformOpOrder
  ss << print_xformOpOrder(xformOps, indent);

  return ss.str();
}